

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardsigmoid_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::HardSigmoid_x86_fma::forward_inplace
          (HardSigmoid_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  undefined1 (*pauVar8) [32];
  int iVar9;
  uint uVar10;
  long lVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar17 [16];
  undefined4 uVar16;
  undefined1 auVar18 [32];
  
  iVar2 = bottom_top_blob->c;
  if (0 < (long)iVar2) {
    uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    pp_Var3 = this->_vptr_HardSigmoid_x86_fma;
    lVar7 = 0;
    auVar12._8_4_ = 0x3f800000;
    auVar12._0_8_ = 0x3f8000003f800000;
    auVar12._12_4_ = 0x3f800000;
    auVar12._16_4_ = 0x3f800000;
    auVar12._20_4_ = 0x3f800000;
    auVar12._24_4_ = 0x3f800000;
    auVar12._28_4_ = 0x3f800000;
    auVar13._8_4_ = 0x3f800000;
    auVar13._0_8_ = 0x3f8000003f800000;
    auVar13._12_4_ = 0x3f800000;
    do {
      pauVar8 = (undefined1 (*) [32])
                (bottom_top_blob->cstep * lVar7 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      if ((int)uVar5 < 8) {
        uVar10 = 0;
      }
      else {
        iVar9 = 7;
        do {
          uVar16 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var3[-3]);
          auVar15._4_4_ = uVar16;
          auVar15._0_4_ = uVar16;
          auVar15._8_4_ = uVar16;
          auVar15._12_4_ = uVar16;
          auVar15._16_4_ = uVar16;
          auVar15._20_4_ = uVar16;
          auVar15._24_4_ = uVar16;
          auVar15._28_4_ = uVar16;
          uVar16 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var3[-3]);
          auVar18._4_4_ = uVar16;
          auVar18._0_4_ = uVar16;
          auVar18._8_4_ = uVar16;
          auVar18._12_4_ = uVar16;
          auVar18._16_4_ = uVar16;
          auVar18._20_4_ = uVar16;
          auVar18._24_4_ = uVar16;
          auVar18._28_4_ = uVar16;
          auVar14 = vfmadd132ps_fma(auVar18,auVar15,*pauVar8);
          auVar15 = vmaxps_avx(ZEXT1632(auVar14),ZEXT1632(ZEXT816(0) << 0x40));
          auVar15 = vminps_avx(auVar15,auVar12);
          *pauVar8 = auVar15;
          pauVar8 = pauVar8 + 1;
          iVar9 = iVar9 + 8;
          uVar10 = uVar5 & 0xfffffff8;
        } while (iVar9 < (int)uVar5);
      }
      uVar6 = uVar10 | 3;
      while ((int)uVar6 < (int)uVar5) {
        uVar16 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var3[-3]);
        auVar14._4_4_ = uVar16;
        auVar14._0_4_ = uVar16;
        auVar14._8_4_ = uVar16;
        auVar14._12_4_ = uVar16;
        uVar16 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var3[-3]);
        auVar17._4_4_ = uVar16;
        auVar17._0_4_ = uVar16;
        auVar17._8_4_ = uVar16;
        auVar17._12_4_ = uVar16;
        auVar14 = vfmadd132ps_fma(auVar17,auVar14,*(undefined1 (*) [16])*pauVar8);
        auVar14 = vmaxps_avx(auVar14,ZEXT816(0) << 0x40);
        auVar14 = vminps_avx(auVar14,auVar13);
        *(undefined1 (*) [16])*pauVar8 = auVar14;
        pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
        uVar6 = uVar10 + 7;
        uVar10 = uVar10 + 4;
      }
      if (uVar5 - uVar10 != 0 && (int)uVar10 <= (int)uVar5) {
        lVar11 = 0;
        do {
          fVar1 = *(float *)(*pauVar8 + lVar11 * 4);
          p_Var4 = pp_Var3[-3];
          uVar16 = 0;
          if ((*(float *)(&this->field_0xd8 + (long)p_Var4) <= fVar1) &&
             (uVar16 = 0x3f800000, fVar1 <= *(float *)(&this->field_0xdc + (long)p_Var4))) {
            auVar14 = vfmadd213ss_fma(ZEXT416((uint)fVar1),
                                      ZEXT416(*(uint *)(&this->field_0xd0 + (long)p_Var4)),
                                      ZEXT416(*(uint *)(&this->field_0xd4 + (long)p_Var4)));
            uVar16 = auVar14._0_4_;
          }
          *(undefined4 *)(*pauVar8 + lVar11 * 4) = uVar16;
          lVar11 = lVar11 + 1;
        } while (uVar5 - uVar10 != (int)lVar11);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar2);
  }
  return 0;
}

Assistant:

int HardSigmoid_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero_avx512 = _mm512_setzero_ps();
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _ans = _mm512_set1_ps(beta);
            _ans = _mm512_fmadd_ps(_p, _mm512_set1_ps(alpha), _ans);
            _ans = _mm512_max_ps(_ans, _zero_avx512);
            _ans = _mm512_min_ps(_ans, _one_avx512);
            _mm512_storeu_ps(ptr, _ans);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero_avx = _mm256_setzero_ps();
        __m256 _one_avx = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero_avx);
            _ans = _mm256_min_ps(_ans, _one_avx);
            _mm256_storeu_ps(ptr, _ans);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero = _mm_setzero_ps();
        __m128 _one = _mm_set1_ps(1.f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _ans = _mm_set1_ps(beta);
            _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
            _ans = _mm_max_ps(_ans, _zero);
            _ans = _mm_min_ps(_ans, _one);
            _mm_store_ps(ptr, _ans);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                *ptr = 1.f;
            else
                *ptr = *ptr * alpha + beta;
            ptr++;
        }
    }

    return 0;
}